

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saslclientio.c
# Opt level: O3

void handle_error(SASL_CLIENT_IO_INSTANCE *sasl_client_io_instance)

{
  int iVar1;
  
  if (sasl_client_io_instance->io_state - IO_STATE_OPENING_UNDERLYING_IO < 2) {
    iVar1 = xio_close(sasl_client_io_instance->underlying_io,on_underlying_io_close_complete,
                      sasl_client_io_instance);
    if (iVar1 != 0) {
      sasl_client_io_instance->io_state = IO_STATE_NOT_OPEN;
      if (sasl_client_io_instance->on_io_open_complete != (ON_IO_OPEN_COMPLETE)0x0) {
        (*sasl_client_io_instance->on_io_open_complete)
                  (sasl_client_io_instance->on_io_open_complete_context,IO_OPEN_ERROR);
        return;
      }
    }
  }
  else if (sasl_client_io_instance->io_state == IO_STATE_OPEN) {
    sasl_client_io_instance->io_state = IO_STATE_ERROR;
    if (sasl_client_io_instance->on_io_error != (ON_IO_ERROR)0x0) {
      (*sasl_client_io_instance->on_io_error)(sasl_client_io_instance->on_io_error_context);
      return;
    }
  }
  return;
}

Assistant:

static void handle_error(SASL_CLIENT_IO_INSTANCE* sasl_client_io_instance)
{
    switch (sasl_client_io_instance->io_state)
    {
    default:
    case IO_STATE_NOT_OPEN:
        break;

    case IO_STATE_OPENING_UNDERLYING_IO:
    case IO_STATE_SASL_HANDSHAKE:
        if (xio_close(sasl_client_io_instance->underlying_io, on_underlying_io_close_complete, sasl_client_io_instance) != 0)
        {
            sasl_client_io_instance->io_state = IO_STATE_NOT_OPEN;
            indicate_open_complete(sasl_client_io_instance, IO_OPEN_ERROR);
        }
        break;

    case IO_STATE_OPEN:
        sasl_client_io_instance->io_state = IO_STATE_ERROR;
        indicate_error(sasl_client_io_instance);
        break;
    }
}